

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

bool __thiscall cfd::core::Psbt::IsFinalizedInput(Psbt *this,uint32_t index)

{
  CfdException *pCVar1;
  allocator local_f1;
  string local_f0;
  CfdSourceLocation local_d0;
  int local_b8;
  undefined1 local_b2;
  allocator local_b1;
  int ret;
  CfdSourceLocation local_90;
  undefined1 local_75;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  size_t local_28;
  size_t data;
  wally_psbt *psbt_pointer;
  Psbt *pPStack_10;
  uint32_t index_local;
  Psbt *this_local;
  
  data = (size_t)this->wally_psbt_pointer_;
  local_28 = 0;
  psbt_pointer._4_4_ = index;
  pPStack_10 = this;
  if ((void *)data == (void *)0x0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x80d;
    local_40.funcname = "IsFinalizedInput";
    logger::warn<>(&local_40,"psbt pointer is null");
    local_75 = 1;
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"psbt pointer is null.",&local_61);
    CfdException::CfdException(pCVar1,kCfdIllegalStateError,&local_60);
    local_75 = 0;
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((*(long *)(data + 0x10) != 0) && ((ulong)index < *(ulong *)(data + 0x18))) {
    local_b8 = wally_psbt_input_is_finalized
                         ((wally_psbt_input *)(*(long *)(data + 0x10) + (ulong)index * 0x110),
                          &local_28);
    if (local_b8 != 0) {
      local_d0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_d0.filename = local_d0.filename + 1;
      local_d0.line = 0x819;
      local_d0.funcname = "IsFinalizedInput";
      logger::warn<int&>(&local_d0,"wally_psbt_is_finalized NG[{}]",&local_b8);
      pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_f0,"psbt input check finalized error.",&local_f1);
      CfdException::CfdException(pCVar1,kCfdIllegalStateError,&local_f0);
      __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
    }
    return local_28 == 1;
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0x813;
  local_90.funcname = "IsFinalizedInput";
  logger::warn<>(&local_90,"psbt input out-of-range.");
  local_b2 = 1;
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&ret,"psbt input out-of-range.",&local_b1);
  CfdException::CfdException(pCVar1,kCfdOutOfRangeError,(string *)&ret);
  local_b2 = 0;
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool Psbt::IsFinalizedInput(uint32_t index) const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  size_t data = 0;
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }

  if ((psbt_pointer->inputs == nullptr) ||
      (psbt_pointer->num_inputs <= index)) {
    warn(CFD_LOG_SOURCE, "psbt input out-of-range.");
    throw CfdException(kCfdOutOfRangeError, "psbt input out-of-range.");
  }

  int ret = wally_psbt_input_is_finalized(&psbt_pointer->inputs[index], &data);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_is_finalized NG[{}]", ret);
    throw CfdException(
        kCfdIllegalStateError, "psbt input check finalized error.");
  }
  return (data == 1);
}